

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
          *this,Static_String *sym)

{
  size_t t_distance;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  
  t_distance = sym->m_size;
  pcVar1 = (this->m_position).m_pos;
  pcVar2 = (this->m_position).m_end;
  if ((ulong)((long)pcVar2 - (long)pcVar1) < t_distance) {
    return false;
  }
  pcVar3 = "";
  if (pcVar1 != pcVar2) {
    pcVar3 = pcVar1;
  }
  sVar4 = 0;
  do {
    if (t_distance == sVar4) {
      Position::operator+=(&this->m_position,t_distance);
      return true;
    }
    pcVar1 = sym->data + sVar4;
    pcVar2 = pcVar3 + sVar4;
    sVar4 = sVar4 + 1;
  } while (*pcVar1 == *pcVar2);
  return false;
}

Assistant:

inline auto Symbol_(const utility::Static_String &sym) noexcept {
        const auto len = sym.size();
        if (m_position.remaining() >= len) {
          const char *file_pos = &(*m_position);
          for (size_t pos = 0; pos < len; ++pos) {
            if (sym.c_str()[pos] != file_pos[pos]) {
              return false;
            }
          }
          m_position += len;
          return true;
        }
        return false;
      }